

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

int multi_getsock(Curl_easy *data,curl_socket_t *socks)

{
  ssl_connect_state sVar1;
  connectdata *conn;
  http_connect_state *phVar2;
  _func_int_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  bool bVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  
  conn = data->conn;
  if (conn == (connectdata *)0x0) {
    return 0;
  }
  uVar6 = data->mstate - CURLM_STATE_WAITRESOLVE;
  if (uVar6 < 0xc) {
    conn->data = data;
  }
  switch(uVar6) {
  case 0:
    iVar4 = Curl_resolv_getsock(conn,socks);
    return iVar4;
  case 1:
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       ((conn->bits).proxy_ssl_connected[0] == false)) {
      sVar1 = conn->ssl[0].connecting_state;
      if (sVar1 == ssl_connect_2_writing) {
        iVar4 = 0x10000;
      }
      else {
        if (sVar1 != ssl_connect_2_reading) {
          return 0;
        }
        iVar4 = 1;
      }
      *socks = conn->sock[0];
      return iVar4;
    }
    if (0xf < (conn->cnnct).state - CONNECT_SOCKS_INIT) {
      lVar7 = 0;
      uVar6 = 0;
      iVar4 = 0;
      bVar3 = true;
      do {
        bVar5 = bVar3;
        if (conn->tempsock[lVar7] != -1) {
          socks[iVar4] = conn->tempsock[lVar7];
          uVar6 = uVar6 | 1 << (iVar4 + 0x10U & 0x1f);
          iVar4 = iVar4 + 1;
        }
        lVar7 = 1;
        bVar3 = false;
      } while (bVar5);
      return uVar6;
    }
    iVar4 = Curl_SOCKS_getsock(conn,socks,0);
    return iVar4;
  case 2:
    phVar2 = conn->connect_state;
    *socks = conn->sock[0];
    iVar4 = 1;
    if (phVar2 == (http_connect_state *)0x0) {
      iVar4 = 0x10000;
    }
    return iVar4;
  case 3:
  case 4:
    UNRECOVERED_JUMPTABLE = conn->handler->proto_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar4 = (*UNRECOVERED_JUMPTABLE)(conn,socks);
      return iVar4;
    }
    *socks = conn->sock[0];
    return 0x10001;
  case 5:
  case 6:
    UNRECOVERED_JUMPTABLE = conn->handler->doing_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar4 = (*UNRECOVERED_JUMPTABLE)(conn,socks);
      return iVar4;
    }
    break;
  case 7:
    UNRECOVERED_JUMPTABLE = conn->handler->domore_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar4 = (*UNRECOVERED_JUMPTABLE)(conn,socks);
      return iVar4;
    }
    break;
  case 8:
  case 9:
    iVar4 = Curl_single_getsock(conn,socks);
    return iVar4;
  }
  return 0;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks)
{
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  if(!data->conn)
    return 0;

  if(data->mstate > CURLM_STATE_CONNECT &&
     data->mstate < CURLM_STATE_COMPLETED) {
    /* Set up ownership correctly */
    data->conn->data = data;
  }

  switch(data->mstate) {
  default:
#if 0 /* switch back on these cases to get the compiler to check for all enums
         to be present */
  case CURLM_STATE_TOOFAST:  /* returns 0, so will not select. */
  case CURLM_STATE_COMPLETED:
  case CURLM_STATE_MSGSENT:
  case CURLM_STATE_INIT:
  case CURLM_STATE_CONNECT:
  case CURLM_STATE_WAITDO:
  case CURLM_STATE_DONE:
  case CURLM_STATE_LAST:
    /* this will get called with CURLM_STATE_COMPLETED when a handle is
       removed */
#endif
    return 0;

  case CURLM_STATE_WAITRESOLVE:
    return Curl_resolv_getsock(data->conn, socks);

  case CURLM_STATE_PROTOCONNECT:
  case CURLM_STATE_SENDPROTOCONNECT:
    return protocol_getsock(data->conn, socks);

  case CURLM_STATE_DO:
  case CURLM_STATE_DOING:
    return doing_getsock(data->conn, socks);

  case CURLM_STATE_WAITPROXYCONNECT:
    return waitproxyconnect_getsock(data->conn, socks);

  case CURLM_STATE_WAITCONNECT:
    return waitconnect_getsock(data->conn, socks);

  case CURLM_STATE_DO_MORE:
    return domore_getsock(data->conn, socks);

  case CURLM_STATE_DO_DONE: /* since is set after DO is completed, we switch
                               to waiting for the same as the *PERFORM
                               states */
  case CURLM_STATE_PERFORM:
    return Curl_single_getsock(data->conn, socks);
  }

}